

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O0

void __thiscall Nova::Parse_Args::Print_Usage(Parse_Args *this,bool do_exit)

{
  uint uVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  long lVar6;
  uint local_24;
  uint j;
  int len;
  int width;
  int i;
  bool do_exit_local;
  Parse_Args *this_local;
  
  poVar2 = std::operator<<(Log::(anonymous_namespace)::cerr,"Usage: ");
  poVar2 = std::operator<<(poVar2,(string *)&this->program_name);
  std::operator<<(poVar2," ");
  len = 0;
  while( true ) {
    sVar3 = std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::size(&this->arg_data_list)
    ;
    if (sVar3 <= (ulong)(long)len) break;
    pvVar4 = std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::operator[]
                       (&this->arg_data_list,(long)len);
    Arg_Data::Print_Synopsis(pvVar4);
    std::operator<<(Log::(anonymous_namespace)::cerr," ");
    len = len + 1;
  }
  len = 0;
  while( true ) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->extra_args_synopsis_list);
    poVar2 = Log::(anonymous_namespace)::cerr;
    if (sVar3 <= (ulong)(long)len) break;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->extra_args_synopsis_list,(long)len);
    poVar2 = std::operator<<(poVar2,(string *)pvVar5);
    std::operator<<(poVar2," ");
    len = len + 1;
  }
  std::ostream::operator<<(Log::(anonymous_namespace)::cerr,std::endl<char,std::char_traits<char>>);
  j = 0;
  len = 0;
  while( true ) {
    sVar3 = std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::size(&this->arg_data_list)
    ;
    if (sVar3 <= (ulong)(long)len) break;
    std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::operator[]
              (&this->arg_data_list,(long)len);
    uVar1 = std::__cxx11::string::length();
    if ((int)j < (int)uVar1) {
      j = uVar1;
    }
    len = len + 1;
  }
  len = 0;
  while( true ) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->extra_args_desc_list);
    if (sVar3 <= (ulong)(long)len) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->extra_args_synopsis_list,(long)len);
    uVar1 = std::__cxx11::string::length();
    if ((int)j < (int)uVar1) {
      j = uVar1;
    }
    len = len + 1;
  }
  len = 0;
  while( true ) {
    sVar3 = std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::size(&this->arg_data_list)
    ;
    if (sVar3 <= (ulong)(long)len) break;
    pvVar4 = std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::operator[]
                       (&this->arg_data_list,(long)len);
    Arg_Data::Print_Description(pvVar4,j + 2);
    std::ostream::operator<<
              (Log::(anonymous_namespace)::cerr,std::endl<char,std::char_traits<char>>);
    len = len + 1;
  }
  len = 0;
  while( true ) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->extra_args_desc_list);
    poVar2 = Log::(anonymous_namespace)::cerr;
    if (sVar3 <= (ulong)(long)len) break;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->extra_args_synopsis_list,(long)len);
    std::operator<<(poVar2,(string *)pvVar5);
    local_24 = 1;
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->extra_args_synopsis_list,(long)len);
      lVar6 = std::__cxx11::string::length();
      poVar2 = Log::(anonymous_namespace)::cerr;
      if ((ulong)((int)(j + 2) - lVar6) < (ulong)local_24) break;
      std::operator<<(Log::(anonymous_namespace)::cerr," ");
      local_24 = local_24 + 1;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->extra_args_desc_list,(long)len);
    poVar2 = std::operator<<(poVar2,(string *)pvVar5);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    len = len + 1;
  }
  if (this->extra_usage_callback != (_func_void *)0x0) {
    (*this->extra_usage_callback)();
  }
  if (do_exit) {
    exit(-1);
  }
  return;
}

Assistant:

void Parse_Args::
Print_Usage(bool do_exit) const
{
    int i;
    Log::cerr<<"Usage: "<<program_name<<" ";
    for(i=0;i<arg_data_list.size();i++)
    {
        arg_data_list[i].Print_Synopsis();
        Log::cerr<<" ";
    }
    for(i=0;i<extra_args_synopsis_list.size();i++) Log::cerr<<extra_args_synopsis_list[i]<<" ";
    Log::cerr<<std::endl;

    int width=0,len;
    for(i=0;i<arg_data_list.size();i++)
    {
        len=(int)arg_data_list[i].str.length();
        if(len>width) width=len;
    }
    for(i=0;i<extra_args_desc_list.size();i++)
    {
        len=(int)extra_args_synopsis_list[i].length();
        if(len>width) width=len;
    }
    for(i=0;i<arg_data_list.size();i++)
    {
        arg_data_list[i].Print_Description(width+2);
        Log::cerr<<std::endl;
    }
    for(i=0;i<extra_args_desc_list.size();i++)
    {
        Log::cerr<<extra_args_synopsis_list[i];
        for(unsigned j=1;j<=width+2-extra_args_synopsis_list[i].length();j++) Log::cerr<<" ";
        Log::cerr<<extra_args_desc_list[i]<<std::endl;
    }
    if(extra_usage_callback) extra_usage_callback();
    if(do_exit) exit(-1);
}